

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

Entry * __thiscall
Lib::
DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntry(DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
            *this,TermList *key)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  uint uVar4;
  Entry *pEVar5;
  int iVar6;
  size_t i;
  long lVar7;
  ulong uVar8;
  Entry *pEVar9;
  ulong local_10;
  
  uVar1 = this->_capacity;
  if (uVar1 == 0) {
    pEVar9 = (Entry *)0x0;
  }
  else {
    local_10 = key->_content;
    uVar4 = 0x811c9dc5;
    lVar7 = 0;
    do {
      uVar4 = (*(byte *)((long)&local_10 + lVar7) ^ uVar4) * 0x1000193;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    uVar8 = (ulong)uVar4 % (ulong)uVar1;
    pEVar3 = this->_entries;
    uVar4 = pEVar3[uVar8].field_0._infoData;
    pEVar9 = (Entry *)0x0;
    if (uVar4 >> 2 == this->_timestamp) {
      pEVar5 = pEVar3 + uVar8;
      if ((pEVar5->_key)._content == local_10) {
        uVar4 = uVar4 & 1;
      }
      else {
        if ((uVar4 & 2) == 0) {
          return (Entry *)0x0;
        }
        iVar6 = (int)((local_10 & 0xffffffff) % (ulong)uVar1);
        do {
          uVar8 = (ulong)((int)uVar8 + iVar6 + (uint)(iVar6 == 0)) % (ulong)uVar1;
          pEVar5 = pEVar3 + uVar8;
          uVar2 = pEVar3[uVar8].field_0._infoData;
          if (uVar2 >> 2 != uVar4 >> 2) break;
        } while ((pEVar5->_key)._content != local_10);
        uVar4 = uVar2 & 1 | (uVar2 ^ uVar4) >> 2;
      }
      pEVar9 = (Entry *)0x0;
      if (uVar4 == 0) {
        pEVar9 = pEVar5;
      }
    }
  }
  return pEVar9;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }